

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastReduceMatrix
               (Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Wec_t *vLevels,Vec_Int_t *vRes,int fSigned,
               int fCla)

{
  uint uVar1;
  int b;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  int NodeC;
  int NodeS;
  int local_60;
  int local_5c;
  ulong local_58;
  Vec_Wec_t *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  uVar1 = vProds->nSize;
  local_58 = (ulong)uVar1;
  if (uVar1 != vLevels->nSize) {
    __assert_fail("nSize == Vec_WecSize(vLevels)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x363,
                  "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                 );
  }
  if (0 < (int)uVar1) {
    uVar12 = 0;
    local_50 = vLevels;
    do {
      if ((long)vProds->nSize <= (long)uVar12) goto LAB_00893cd8;
      local_38 = uVar12 + 1;
      local_48 = uVar12 << 4;
      uVar8 = local_38;
      local_40 = uVar12;
      while( true ) {
        uVar12 = uVar8;
        iVar10 = *(int *)((long)&vProds->pArray->nSize + local_48);
        if (iVar10 < 3) break;
        pVVar11 = (Vec_Int_t *)((long)&vProds->pArray->nCap + local_48);
        piVar4 = pVVar11->pArray;
        pVVar11->nSize = iVar10 - 1U;
        iVar5 = piVar4[iVar10 - 1U];
        pVVar11->nSize = iVar10 - 2U;
        b = piVar4[iVar10 - 2U];
        pVVar11->nSize = iVar10 - 3U;
        if ((long)vLevels->nSize <= (long)local_40) goto LAB_00893cd8;
        iVar2 = *(int *)((long)&vLevels->pArray->nSize + local_48);
        if (iVar2 < 1) {
LAB_00893cf7:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
        }
        iVar10 = piVar4[iVar10 - 3U];
        pVVar6 = (Vec_Int_t *)((long)&vLevels->pArray->nCap + local_48);
        piVar4 = pVVar6->pArray;
        pVVar6->nSize = iVar2 - 1U;
        if (iVar2 == 1) goto LAB_00893cf7;
        iVar3 = piVar4[iVar2 - 1U];
        pVVar6->nSize = iVar2 - 2U;
        if (iVar2 < 3) goto LAB_00893cf7;
        iVar7 = piVar4[iVar2 - 2U];
        pVVar6->nSize = iVar2 - 3U;
        iVar2 = piVar4[iVar2 - 3U];
        Wlc_BlastFullAdder(pNew,iVar5,b,iVar10,&local_60,&local_5c);
        uVar8 = local_38;
        if (iVar7 < iVar3) {
          iVar7 = iVar3;
        }
        if (iVar7 <= iVar2) {
          iVar7 = iVar2;
        }
        Wlc_IntInsert(pVVar11,pVVar6,local_5c,iVar7 + 2);
        vLevels = local_50;
        if ((((long)vProds->nSize <= (long)uVar8) || ((long)local_50->nSize <= (long)uVar8)) ||
           (Wlc_IntInsert(vProds->pArray + uVar8,local_50->pArray + uVar8,local_60,iVar7 + 1),
           (long)vProds->nSize <= (long)local_40)) goto LAB_00893cd8;
      }
    } while (uVar12 != local_58);
  }
  uVar12 = local_58;
  iVar10 = (int)local_58;
  if (0 < iVar10) {
    uVar8 = 0;
    do {
      if ((long)vProds->nSize <= (long)uVar8) goto LAB_00893cd8;
      iVar5 = vProds->pArray[uVar8].nSize;
      if (iVar5 < 2) {
        pVVar11 = vProds->pArray + uVar8;
        do {
          Vec_IntPush(pVVar11,0);
          iVar5 = pVVar11->nSize;
        } while (iVar5 < 2);
      }
      if (iVar5 != 2) {
        __assert_fail("Vec_IntSize(vProd) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                      ,0x389,
                      "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                     );
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar12);
  }
  if (vLevels->nSize < 1) {
LAB_00893cd8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar11 = vLevels->pArray;
  vRes->nSize = 0;
  pVVar11->nSize = 0;
  if (0 < iVar10) {
    lVar9 = 8;
    uVar12 = 0;
    do {
      if ((long)vProds->nSize <= (long)uVar12) goto LAB_00893cd8;
      pVVar6 = vProds->pArray;
      if ((*(int *)((long)pVVar6 + lVar9 + -4) < 1) ||
         (Vec_IntPush(vRes,**(int **)((long)&pVVar6->nCap + lVar9)),
         *(int *)((long)pVVar6 + lVar9 + -4) < 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(pVVar11,*(int *)(*(long *)((long)&pVVar6->nCap + lVar9) + 4));
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + 0x10;
    } while (local_58 != uVar12);
  }
  Vec_IntPush(vRes,0);
  Vec_IntPush(pVVar11,0);
  if (fCla == 0) {
    Wlc_BlastAdder(pNew,vRes->pArray,pVVar11->pArray,vRes->nSize,0);
    return;
  }
  Wlc_BlastAdderCLA(pNew,vRes->pArray,pVVar11->pArray,vRes->nSize,fSigned,0);
  return;
}

Assistant:

void Wlc_BlastReduceMatrix( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Wec_t * vLevels, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Int_t * vLevel, * vProd;
    int i, NodeS, NodeC, LevelS, LevelC, Node1, Node2, Node3, Level1, Level2, Level3;
    int nSize = Vec_WecSize(vProds);
    assert( nSize == Vec_WecSize(vLevels) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd  = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            vLevel = Vec_WecEntry( vLevels, i );

            Level1 = Vec_IntPop( vLevel );
            Level2 = Vec_IntPop( vLevel );
            Level3 = Vec_IntPop( vLevel );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            LevelS = Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 ) + 2;
            LevelC = LevelS - 1;

            Wlc_IntInsert( vProd, vLevel, NodeS, LevelS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            vLevel = Vec_WecEntry( vLevels, i+1 );

            Wlc_IntInsert( vProd, vLevel, NodeC, LevelC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }
//    Vec_WecPrint( vProds, 0 );

    vLevel = Vec_WecEntry( vLevels, 0 );
    Vec_IntClear( vRes );
    Vec_IntClear( vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,   Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vLevel, Vec_IntEntry(vProd, 1) );
    }
    Vec_IntPush( vRes,   0 );
    Vec_IntPush( vLevel, 0 );

    if ( fCla )
        Wlc_BlastAdderCLA( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), Vec_IntSize(vRes), fSigned, 0 );
    else
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), Vec_IntSize(vRes), 0 );
}